

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O3

bool __thiscall
cmSourceGroupCommand::InitialPass
          (cmSourceGroupCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  cmSourceGroup *this_00;
  ulong uVar6;
  char *__s;
  ostream *poVar7;
  pointer pbVar8;
  _Alloc_hider _Var9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  string delimiter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  string error;
  string local_210;
  cmSourceGroup *local_1f0;
  string local_1e8;
  ulong local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar8 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]
                              ) + 1);
    }
    return false;
  }
  iVar4 = std::__cxx11::string::compare((char *)pbVar8);
  if (iVar4 == 0) {
    local_1a0 = (char *)0x0;
    local_198[0]._M_local_buf[0] = '\0';
    local_1a8 = (undefined1  [8])local_198;
    bVar3 = processTree(this,args,(string *)local_1a8);
    if (!bVar3) {
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    }
    if (local_1a8 == (undefined1  [8])local_198) {
      return bVar3;
    }
    local_210.field_2._M_allocated_capacity =
         CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]);
    _Var9._M_p = (pointer)local_1a8;
    goto LAB_002e5ace;
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\\","");
  pcVar1 = (this->super_cmCommand).Makefile;
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SOURCE_GROUP_DELIMITER","");
  pcVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0])
                    + 1);
  }
  if (pcVar5 != (char *)0x0) {
    pcVar1 = (this->super_cmCommand).Makefile;
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SOURCE_GROUP_DELIMITER","")
    ;
    pcVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
    strlen(pcVar5);
    std::__cxx11::string::_M_replace
              ((ulong)&local_210,0,(char *)local_210._M_string_length,(ulong)pcVar5);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  cmSystemTools::tokenize
            (&local_1c0,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_210);
  this_00 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&local_1c0);
  if (this_00 == (cmSourceGroup *)0x0) {
    cmMakefile::AddSourceGroup((this->super_cmCommand).Makefile,&local_1c0,(char *)0x0);
    this_00 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&local_1c0);
    if (this_00 != (cmSourceGroup *)0x0) goto LAB_002e56a0;
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Could not create or find source group","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_002e5a91:
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]
                              ) + 1);
    }
LAB_002e5ab3:
    bVar3 = false;
  }
  else {
LAB_002e56a0:
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
    if (uVar6 == 0x40) {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + 1));
      if (iVar4 != 0) {
        bVar3 = true;
        cmSourceGroup::SetGroupRegex
                  (this_00,(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        goto LAB_002e5ab5;
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
    }
    bVar3 = true;
    if (0x20 < uVar6) {
      uVar11 = 1;
      uVar6 = 0;
      local_1f0 = this_00;
      do {
        uVar10 = (uint)uVar11;
        iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar11));
        uVar12 = CONCAT71((int7)(uVar6 >> 8),iVar4 != 0);
        if (iVar4 == 0) {
          uVar10 = uVar10 + 1;
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              (ulong)uVar10) {
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"REGULAR_EXPRESSION argument given without a regex.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
            goto LAB_002e5a91;
          }
          cmSourceGroup::SetGroupRegex(local_1f0,pbVar8[uVar10]._M_dataplus._M_p);
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar11));
          if (iVar4 != 0) {
            if ((uVar6 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unknown argument \"",0x12);
              pbVar8 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,pbVar8[uVar11]._M_dataplus._M_p,
                                  pbVar8[uVar11]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"Perhaps the FILES keyword is missing.\n",0x26);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_002e5ab3;
            }
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_1a8 = (undefined1  [8])local_198;
            pcVar2 = pbVar8[uVar11]._M_dataplus._M_p;
            local_1c8 = uVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,pcVar2,pcVar2 + pbVar8[uVar11]._M_string_length);
            bVar3 = cmsys::SystemTools::FileIsFullPath((char *)local_1a8);
            if (!bVar3) {
              __s = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
              pcVar5 = local_1a0;
              strlen(__s);
              std::__cxx11::string::_M_replace((ulong)local_1a8,0,pcVar5,(ulong)__s);
              std::__cxx11::string::append(local_1a8);
              std::__cxx11::string::_M_append
                        (local_1a8,
                         (ulong)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p)
              ;
            }
            cmsys::SystemTools::CollapseFullPath(&local_1e8,(string *)local_1a8);
            std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            cmSourceGroup::AddGroupFile(local_1f0,(string *)local_1a8);
            uVar12 = local_1c8;
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8,
                              CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                       local_198[0]._M_local_buf[0]) + 1);
              uVar12 = local_1c8;
            }
          }
        }
        uVar11 = (ulong)(uVar10 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar6 = uVar12;
      } while (uVar11 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                               5));
      bVar3 = true;
    }
  }
LAB_002e5ab5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  _Var9._M_p = local_210._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p == &local_210.field_2) {
    return bVar3;
  }
LAB_002e5ace:
  operator_delete(_Var9._M_p,local_210.field_2._M_allocated_capacity + 1);
  return bVar3;
}

Assistant:

bool cmSourceGroupCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  if (args[0] == "TREE") {
    std::string error;

    if (!processTree(args, error)) {
      this->SetError(error);
      return false;
    }

    return true;
  }

  std::string delimiter = "\\";
  if (this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER")) {
    delimiter = this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER");
  }

  std::vector<std::string> folders =
    cmSystemTools::tokenize(args[0], delimiter);

  cmSourceGroup* sg = CM_NULLPTR;
  sg = this->Makefile->GetSourceGroup(folders);
  if (!sg) {
    this->Makefile->AddSourceGroup(folders);
    sg = this->Makefile->GetSourceGroup(folders);
  }

  if (!sg) {
    this->SetError("Could not create or find source group");
    return false;
  }
  // If only two arguments are given, the pre-1.8 version of the
  // command is being invoked.
  if (args.size() == 2 && args[1] != "FILES") {
    sg->SetGroupRegex(args[1].c_str());
    return true;
  }

  // Process arguments.
  bool doingFiles = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "REGULAR_EXPRESSION") {
      // Next argument must specify the regex.
      if (i + 1 < args.size()) {
        ++i;
        sg->SetGroupRegex(args[i].c_str());
      } else {
        this->SetError("REGULAR_EXPRESSION argument given without a regex.");
        return false;
      }
      doingFiles = false;
    } else if (args[i] == "FILES") {
      // Next arguments will specify files.
      doingFiles = true;
    } else if (doingFiles) {
      // Convert name to full path and add to the group's list.
      std::string src = args[i];
      if (!cmSystemTools::FileIsFullPath(src.c_str())) {
        src = this->Makefile->GetCurrentSourceDirectory();
        src += "/";
        src += args[i];
      }
      src = cmSystemTools::CollapseFullPath(src);
      sg->AddGroupFile(src);
    } else {
      std::ostringstream err;
      err << "Unknown argument \"" << args[i] << "\".  "
          << "Perhaps the FILES keyword is missing.\n";
      this->SetError(err.str());
      return false;
    }
  }

  return true;
}